

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O2

int __thiscall dgrminer::PartialUnion::getAntecedentLabel(PartialUnion *this,int label)

{
  int iVar1;
  iterator iVar2;
  int label_local;
  
  label_local = label;
  iVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::find(&(this->antecedentLabelsOfLabels)._M_t,&label_local);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->antecedentLabelsOfLabels)._M_t._M_impl.super__Rb_tree_header) {
    iVar1 = -100;
  }
  else {
    iVar1 = *(int *)&iVar2._M_node[1].field_0x4;
  }
  return iVar1;
}

Assistant:

int PartialUnion::getAntecedentLabel(int label)
	{
		auto it = antecedentLabelsOfLabels.find(label);
		if (it != antecedentLabelsOfLabels.end()) {
			return it->second;
		}
		else
		{
			return -100;
		}
	}